

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::DGXMLScanner::scanAttValue
          (DGXMLScanner *this,XMLAttDef *attDef,XMLCh *attrName,XMLBuffer *toFill)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  UnexpectedEOFException *this_00;
  XMLSize_t XVar4;
  XMLSize_t XVar5;
  XMLReader *pXVar6;
  bool local_8f;
  bool local_8e;
  bool local_8d;
  AttTypes local_8c;
  EndOfEntityException *anon_var_0;
  XMLCh tmpBuf [9];
  byte local_4f;
  byte local_4e;
  byte local_4d;
  int local_4c;
  bool escaped;
  bool gotLeadingSurrogate;
  bool firstNonWS;
  States curState;
  XMLCh secondCh;
  XMLCh nextCh;
  XMLSize_t XStack_40;
  bool isAttTokenizedExternal;
  XMLSize_t curReader;
  XMLCh quoteCh;
  XMLBuffer *pXStack_30;
  AttTypes type;
  XMLBuffer *toFill_local;
  XMLCh *attrName_local;
  XMLAttDef *attDef_local;
  DGXMLScanner *this_local;
  
  pXStack_30 = toFill;
  toFill_local = (XMLBuffer *)attrName;
  attrName_local = (XMLCh *)attDef;
  attDef_local = (XMLAttDef *)this;
  if (attDef == (XMLAttDef *)0x0) {
    local_8c = AttTypes_Min;
  }
  else {
    local_8c = XMLAttDef::getType(attDef);
  }
  curReader._4_4_ = local_8c;
  XMLBuffer::reset(pXStack_30);
  bVar2 = ReaderMgr::skipIfQuote
                    (&(this->super_XMLScanner).fReaderMgr,(XMLCh *)((long)&curReader + 2));
  if (!bVar2) {
    return false;
  }
  XStack_40 = ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
  if (attrName_local == (XMLCh *)0x0) {
    local_8f = false;
  }
  else {
    bVar2 = XMLAttDef::isExternal((XMLAttDef *)attrName_local);
    local_8d = false;
    if (bVar2) {
      local_8e = true;
      if ((((curReader._4_4_ != ID) && (local_8e = true, curReader._4_4_ != IDRef)) &&
          (local_8e = true, curReader._4_4_ != IDRefs)) &&
         (((local_8e = true, curReader._4_4_ != Entity &&
           (local_8e = true, curReader._4_4_ != Entities)) &&
          (local_8e = true, curReader._4_4_ != NmToken)))) {
        local_8e = curReader._4_4_ == NmTokens;
      }
      local_8d = local_8e;
    }
    local_8f = local_8d;
  }
  curState._3_1_ = local_8f;
  _gotLeadingSurrogate = L'\0';
  local_4c = 1;
  local_4d = 0;
  local_4e = 0;
LAB_00342c08:
  do {
    curState._0_2_ = ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
    XVar5 = XStack_40;
    if ((undefined2)curState == L'\0') {
      this_00 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
      UnexpectedEOFException::UnexpectedEOFException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                 ,0xb04,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(this_00,&UnexpectedEOFException::typeinfo,
                  UnexpectedEOFException::~UnexpectedEOFException);
    }
    if ((undefined2)curState == curReader._2_2_) {
      XVar4 = ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
      uVar1 = XStack_40;
      if (XVar5 == XVar4) {
        return true;
      }
      XVar5 = ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
      if (XVar5 < uVar1) {
        XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
        return false;
      }
    }
    local_4f = 0;
    if ((undefined2)curState == 0x26) {
      iVar3 = (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xd])
                        (this,1,&curState,&gotLeadingSurrogate,&local_4f);
      if (iVar3 != 1) {
        local_4e = 0;
        goto LAB_00342c08;
      }
    }
    else if (((ushort)(undefined2)curState < 0xd800) || (0xdbff < (ushort)(undefined2)curState)) {
      if (((ushort)(undefined2)curState < 0xdc00) || (0xdfff < (ushort)(undefined2)curState)) {
        if ((local_4e & 1) != 0) {
          XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
        }
        pXVar6 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
        bVar2 = XMLReader::isXMLChar(pXVar6,(undefined2)curState);
        if (!bVar2) {
          XMLString::binToText
                    ((uint)(ushort)(undefined2)curState,(XMLCh *)&anon_var_0,8,0x10,
                     (this->super_XMLScanner).fMemoryManager);
          XMLScanner::emitError
                    (&this->super_XMLScanner,InvalidCharacterInAttrValue,(XMLCh *)toFill_local,
                     (XMLCh *)&anon_var_0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      else if ((local_4e & 1) == 0) {
        XMLScanner::emitError(&this->super_XMLScanner,Unexpected2ndSurrogateChar);
      }
      local_4e = 0;
    }
    else if ((local_4e & 1) == 0) {
      local_4e = 1;
    }
    else {
      XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
    }
    if (((local_4f & 1) == 0) && ((undefined2)curState == 0x3c)) {
      XMLScanner::emitError
                (&this->super_XMLScanner,BracketInAttrValue,(XMLCh *)toFill_local,(XMLCh *)0x0,
                 (XMLCh *)0x0,(XMLCh *)0x0);
    }
    if (curReader._4_4_ == AttTypes_Min) {
      if (((local_4f & 1) == 0) &&
         ((((undefined2)curState == 9 || ((undefined2)curState == 10)) ||
          ((undefined2)curState == 0xd)))) {
        if (((((this->super_XMLScanner).fStandalone & 1U) != 0) &&
            (((this->super_XMLScanner).fValidate & 1U) != 0)) &&
           ((curState._3_1_ & 1) != InWhitespace >> 0x18)) {
          XMLValidator::emitError
                    ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,
                     (XMLCh *)toFill_local,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        curState._0_2_ = 0x20;
      }
      goto LAB_003430f1;
    }
    if (local_4c == 0) {
      if (((local_4f & 1) == 0) || ((undefined2)curState == 0x20)) break;
      goto LAB_00342fda;
    }
    if (local_4c != 1) goto LAB_003430f1;
    if ((undefined2)curState != 0x20) {
      pXVar6 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
      bVar2 = XMLReader::isWhitespace(pXVar6,(undefined2)curState);
      if ((!bVar2) || ((local_4f & 1) != 0)) {
        local_4d = 1;
        goto LAB_003430f1;
      }
    }
    local_4c = 0;
    if ((((((this->super_XMLScanner).fStandalone & 1U) != 0) &&
         (((this->super_XMLScanner).fValidate & 1U) != 0)) &&
        ((curState._3_1_ & 1) != InWhitespace >> 0x18)) &&
       (((local_4d & 1) == 0 ||
        (((undefined2)curState != 0x20 &&
         (bVar2 = ReaderMgr::lookingAtSpace(&(this->super_XMLScanner).fReaderMgr), bVar2)))))) {
      XMLValidator::emitError
                ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,(XMLCh *)toFill_local,
                 (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  } while( true );
  pXVar6 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
  bVar2 = XMLReader::isWhitespace(pXVar6,(undefined2)curState);
  if (!bVar2) {
LAB_00342fda:
    if ((local_4d & 1) != 0) {
      XMLBuffer::append(pXStack_30,L' ');
    }
    local_4c = 1;
    local_4d = 1;
LAB_003430f1:
    XMLBuffer::append(pXStack_30,(undefined2)curState);
    if (_gotLeadingSurrogate != L'\0') {
      XMLBuffer::append(pXStack_30,_gotLeadingSurrogate);
      _gotLeadingSurrogate = L'\0';
    }
  }
  goto LAB_00342c08;
}

Assistant:

bool DGXMLScanner::scanAttValue(  const   XMLAttDef* const    attDef
                                  , const XMLCh *const attrName
                                  ,       XMLBuffer&          toFill)
{
    enum States
    {
        InWhitespace
        , InContent
    };

    // Get the type and name
    const XMLAttDef::AttTypes type = (attDef)
                        ?attDef->getType()
                        :XMLAttDef::CData;

    // Reset the target buffer
    toFill.reset();

    // Get the next char which must be a single or double quote
    XMLCh quoteCh;
    if (!fReaderMgr.skipIfQuote(quoteCh))
        return false;

    //  We have to get the current reader because we have to ignore closing
    //  quotes until we hit the same reader again.
    const XMLSize_t curReader = fReaderMgr.getCurrentReaderNum();

    // check to see if it's a tokenized type that is declared externally 
    bool  isAttTokenizedExternal = (attDef)
                                   ?attDef->isExternal() && (type == XMLAttDef::ID || 
                                                             type == XMLAttDef::IDRef || 
                                                             type == XMLAttDef::IDRefs || 
                                                             type == XMLAttDef::Entity || 
                                                             type == XMLAttDef::Entities || 
                                                             type == XMLAttDef::NmToken || 
                                                             type == XMLAttDef::NmTokens)
                                   :false;

    //  Loop until we get the attribute value. Note that we use a double
    //  loop here to avoid the setup/teardown overhead of the exception
    //  handler on every round.
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    States  curState = InContent;
    bool    firstNonWS = false;
    bool    gotLeadingSurrogate = false;
    bool    escaped;
    while (true)
    {
    try
    {
        while(true)
        {
            nextCh = fReaderMgr.getNextChar();

            if (!nextCh)
                ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

            // Check for our ending quote in the same entity
            if (nextCh == quoteCh)
            {
                if (curReader == fReaderMgr.getCurrentReaderNum())
                    return true;

                // Watch for spillover into a previous entity
                if (curReader > fReaderMgr.getCurrentReaderNum())
                {
                    emitError(XMLErrs::PartialMarkupInEntity);
                    return false;
                }
            }

            //  Check for an entity ref now, before we let it affect our
            //  whitespace normalization logic below. We ignore the empty flag
            //  in this one.
            escaped = false;
            if (nextCh == chAmpersand)
            {
                if (scanEntityRef(true, nextCh, secondCh, escaped) != EntityExp_Returned)
                {
                    gotLeadingSurrogate = false;
                    continue;
                }
            }
            else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                // Deal with surrogate pairs
                //  Its a leading surrogate. If we already got one, then
                //  issue an error, else set leading flag to make sure that
                //  we look for a trailing next time.
                if (gotLeadingSurrogate)
                    emitError(XMLErrs::Expected2ndSurrogateChar);
                else
                    gotLeadingSurrogate = true;
            }
            else
            {
                //  If its a trailing surrogate, make sure that we are
                //  prepared for that. Else, its just a regular char so make
                //  sure that we were not expected a trailing surrogate.
                if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                {
                    // Its trailing, so make sure we were expecting it
                    if (!gotLeadingSurrogate)
                        emitError(XMLErrs::Unexpected2ndSurrogateChar);
                }
                else
                {
                    //  Its just a char, so make sure we were not expecting a
                    //  trailing surrogate.
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    // Its got to at least be a valid XML character
                    if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                    {
                        XMLCh tmpBuf[9];
                        XMLString::binToText
                        (
                            nextCh
                            , tmpBuf
                            , 8
                            , 16
                            , fMemoryManager
                        );
                        emitError(XMLErrs::InvalidCharacterInAttrValue, attrName, tmpBuf);
                    }
                }
                gotLeadingSurrogate = false;
            }

            //  If its not escaped, then make sure its not a < character, which
            //  is not allowed in attribute values.
            if (!escaped && (nextCh == chOpenAngle))
                emitError(XMLErrs::BracketInAttrValue, attrName);

            //  If the attribute is a CDATA type we do simple replacement of
            //  tabs and new lines with spaces, if the character is not escaped
            //  by way of a char ref.
            //
            //  Otherwise, we do the standard non-CDATA normalization of
            //  compressing whitespace to single spaces and getting rid of leading
            //  and trailing whitespace.
            if (type == XMLAttDef::CData)
            {
                if (!escaped)
                {
                    if ((nextCh == 0x09) || (nextCh == 0x0A) || (nextCh == 0x0D))
                    {
                        // Check Validity Constraint for Standalone document declaration
                        // XML 1.0, Section 2.9
                        if (fStandalone && fValidate && isAttTokenizedExternal)
                        {
                             // Can't have a standalone document declaration of "yes" if  attribute
                             // values are subject to normalisation
                             fValidator->emitError(XMLValid::NoAttNormForStandalone, attrName);
                        }
                        nextCh = chSpace;
                    }
                }
            }
            else
            {
                if (curState == InWhitespace)
                {
                    if ((escaped && nextCh != chSpace) || !fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                    {
                        if (firstNonWS)
                            toFill.append(chSpace);
                        curState = InContent;
                        firstNonWS = true;
                    }
                    else
                    {
                        continue;
                    }
                }
                else if (curState == InContent)
                {
                    if ((nextCh == chSpace) ||
                        (fReaderMgr.getCurrentReader()->isWhitespace(nextCh) && !escaped))
                    {
                        curState = InWhitespace;

                        // Check Validity Constraint for Standalone document declaration
                        // XML 1.0, Section 2.9
                        if (fStandalone && fValidate && isAttTokenizedExternal)
                        {
                            if (!firstNonWS || (nextCh != chSpace && fReaderMgr.lookingAtSpace()))
                            {
                                 // Can't have a standalone document declaration of "yes" if  attribute
                                 // values are subject to normalisation
                                 fValidator->emitError(XMLValid::NoAttNormForStandalone, attrName);
                            }
                        }
                        continue;
                    }
                    firstNonWS = true;
                }
            }

            // Else add it to the buffer
            toFill.append(nextCh);

            if (secondCh)
            {
                toFill.append(secondCh);
                secondCh=0;
            }
        }
    }
    catch(const EndOfEntityException&)
    {
        // Just eat it and continue.
        gotLeadingSurrogate = false;
        escaped = false;
    }
    }
    return true;
}